

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jddctmgr.c
# Opt level: O1

void start_pass(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  jpeg_error_mgr *pjVar3;
  jpeg_component_info *pjVar4;
  int iVar5;
  code *pcVar6;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var7;
  int (*paiVar8) [64];
  long lVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  
  pjVar2 = cinfo->entropy;
  iVar1 = cinfo->Ss;
  if (cinfo->progressive_mode == 0) {
    if ((((iVar1 != 0) || (cinfo->Ah != 0)) || (cinfo->Al != 0)) ||
       ((cinfo->Se < 0x40 && (cinfo->Se != cinfo->lim_Se)))) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x7d;
      (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
    }
    pcVar6 = decode_mcu;
    goto LAB_00113a23;
  }
  iVar10 = cinfo->Se;
  if (iVar1 == 0) {
    if (iVar10 == 0) goto LAB_001138ad;
LAB_001138ca:
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x11;
    (pjVar3->msg_parm).i[0] = iVar1;
    (cinfo->err->msg_parm).i[1] = cinfo->Se;
    (cinfo->err->msg_parm).i[2] = cinfo->Ah;
    (cinfo->err->msg_parm).i[3] = cinfo->Al;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  else {
    if (((iVar10 < iVar1) || (cinfo->lim_Se < iVar10)) || (cinfo->comps_in_scan != 1))
    goto LAB_001138ca;
LAB_001138ad:
    if (((cinfo->Ah != 0) && (cinfo->Ah + -1 != cinfo->Al)) || (0xd < cinfo->Al)) goto LAB_001138ca;
  }
  if (0 < cinfo->comps_in_scan) {
    lVar9 = 0;
    do {
      iVar1 = cinfo->cur_comp_info[lVar9]->component_index;
      paiVar8 = cinfo->coef_bits + iVar1;
      if ((cinfo->Ss != 0) && ((*paiVar8)[0] < 0)) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x76;
        (pjVar3->msg_parm).i[0] = iVar1;
        (cinfo->err->msg_parm).i[1] = 0;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
      }
      iVar10 = cinfo->Ss;
      if (iVar10 <= cinfo->Se) {
        lVar12 = (long)iVar10 + -1;
        do {
          iVar5 = (*paiVar8)[lVar12 + 1];
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (cinfo->Ah != iVar5) {
            pjVar3 = cinfo->err;
            pjVar3->msg_code = 0x76;
            (pjVar3->msg_parm).i[0] = iVar1;
            (cinfo->err->msg_parm).i[1] = iVar10;
            (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
          }
          (*paiVar8)[lVar12 + 1] = cinfo->Al;
          lVar12 = lVar12 + 1;
          iVar10 = iVar10 + 1;
        } while (lVar12 < cinfo->Se);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < cinfo->comps_in_scan);
  }
  if (cinfo->Ah == 0) {
    if (cinfo->Ss == 0) {
      pcVar6 = decode_mcu_DC_first;
    }
    else {
      pcVar6 = decode_mcu_AC_first;
    }
  }
  else if (cinfo->Ss == 0) {
    pcVar6 = decode_mcu_DC_refine;
  }
  else {
    pcVar6 = decode_mcu_AC_refine;
  }
LAB_00113a23:
  pjVar2->decode_mcu = pcVar6;
  if (0 < cinfo->comps_in_scan) {
    lVar9 = 0;
    do {
      pjVar4 = cinfo->cur_comp_info[lVar9];
      if ((cinfo->progressive_mode == 0) || ((cinfo->Ss == 0 && (cinfo->Ah == 0)))) {
        iVar1 = pjVar4->dc_tbl_no;
        uVar11 = (ulong)iVar1;
        if (0xf < uVar11) {
          pjVar3 = cinfo->err;
          pjVar3->msg_code = 0x32;
          (pjVar3->msg_parm).i[0] = iVar1;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        if ((&pjVar2[4].decode_mcu)[uVar11] == (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0)
        {
          p_Var7 = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)
                   (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x40);
          (&pjVar2[4].decode_mcu)[uVar11] = p_Var7;
        }
        p_Var7 = (&pjVar2[4].decode_mcu)[uVar11];
        *(undefined8 *)(p_Var7 + 0x30) = 0;
        *(undefined8 *)(p_Var7 + 0x38) = 0;
        *(undefined8 *)(p_Var7 + 0x20) = 0;
        *(undefined8 *)(p_Var7 + 0x28) = 0;
        *(undefined8 *)(p_Var7 + 0x10) = 0;
        *(undefined8 *)(p_Var7 + 0x18) = 0;
        *(undefined8 *)p_Var7 = 0;
        *(undefined8 *)(p_Var7 + 8) = 0;
        *(undefined4 *)((long)&pjVar2[2].start_pass + lVar9 * 4 + 4) = 0;
        *(undefined4 *)((long)&pjVar2[3].start_pass + lVar9 * 4 + 4) = 0;
      }
      if (cinfo->progressive_mode == 0) {
        iVar1 = cinfo->lim_Se;
      }
      else {
        iVar1 = cinfo->Ss;
      }
      if (iVar1 != 0) {
        iVar1 = pjVar4->ac_tbl_no;
        uVar11 = (ulong)iVar1;
        if (0xf < uVar11) {
          pjVar3 = cinfo->err;
          pjVar3->msg_code = 0x32;
          (pjVar3->msg_parm).i[0] = iVar1;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        if ((&pjVar2[0xc].decode_mcu)[uVar11] == (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0
           ) {
          p_Var7 = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)
                   (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
          (&pjVar2[0xc].decode_mcu)[uVar11] = p_Var7;
        }
        memset((&pjVar2[0xc].decode_mcu)[uVar11],0,0x100);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < cinfo->comps_in_scan);
  }
  pjVar2[1].start_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar2[1].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
  *(undefined4 *)&pjVar2[2].start_pass = 0xfffffff0;
  *(uint *)((long)&pjVar2[4].start_pass + 4) = cinfo->restart_interval;
  return;
}

Assistant:

METHODDEF(void)
start_pass (j_decompress_ptr cinfo)
{
  my_idct_ptr idct = (my_idct_ptr) cinfo->idct;
  int ci, i;
  jpeg_component_info *compptr;
  int method = 0;
  inverse_DCT_method_ptr method_ptr = NULL;
  JQUANT_TBL * qtbl;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Select the proper IDCT routine for this component's scaling */
    switch ((compptr->DCT_h_scaled_size << 8) + compptr->DCT_v_scaled_size) {
#ifdef IDCT_SCALING_SUPPORTED
    case ((1 << 8) + 1):
      method_ptr = jpeg_idct_1x1;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((2 << 8) + 2):
      method_ptr = jpeg_idct_2x2;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((3 << 8) + 3):
      method_ptr = jpeg_idct_3x3;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((4 << 8) + 4):
      method_ptr = jpeg_idct_4x4;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((5 << 8) + 5):
      method_ptr = jpeg_idct_5x5;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((6 << 8) + 6):
      method_ptr = jpeg_idct_6x6;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((7 << 8) + 7):
      method_ptr = jpeg_idct_7x7;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((9 << 8) + 9):
      method_ptr = jpeg_idct_9x9;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((10 << 8) + 10):
      method_ptr = jpeg_idct_10x10;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((11 << 8) + 11):
      method_ptr = jpeg_idct_11x11;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((12 << 8) + 12):
      method_ptr = jpeg_idct_12x12;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((13 << 8) + 13):
      method_ptr = jpeg_idct_13x13;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((14 << 8) + 14):
      method_ptr = jpeg_idct_14x14;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((15 << 8) + 15):
      method_ptr = jpeg_idct_15x15;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((16 << 8) + 16):
      method_ptr = jpeg_idct_16x16;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((16 << 8) + 8):
      method_ptr = jpeg_idct_16x8;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((14 << 8) + 7):
      method_ptr = jpeg_idct_14x7;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((12 << 8) + 6):
      method_ptr = jpeg_idct_12x6;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((10 << 8) + 5):
      method_ptr = jpeg_idct_10x5;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((8 << 8) + 4):
      method_ptr = jpeg_idct_8x4;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((6 << 8) + 3):
      method_ptr = jpeg_idct_6x3;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((4 << 8) + 2):
      method_ptr = jpeg_idct_4x2;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((2 << 8) + 1):
      method_ptr = jpeg_idct_2x1;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((8 << 8) + 16):
      method_ptr = jpeg_idct_8x16;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((7 << 8) + 14):
      method_ptr = jpeg_idct_7x14;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((6 << 8) + 12):
      method_ptr = jpeg_idct_6x12;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((5 << 8) + 10):
      method_ptr = jpeg_idct_5x10;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((4 << 8) + 8):
      method_ptr = jpeg_idct_4x8;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((3 << 8) + 6):
      method_ptr = jpeg_idct_3x6;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((2 << 8) + 4):
      method_ptr = jpeg_idct_2x4;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
    case ((1 << 8) + 2):
      method_ptr = jpeg_idct_1x2;
      method = JDCT_ISLOW;	/* jidctint uses islow-style table */
      break;
#endif
    case ((DCTSIZE << 8) + DCTSIZE):
      switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
      case JDCT_ISLOW:
	method_ptr = jpeg_idct_islow;
	method = JDCT_ISLOW;
	break;
#endif
#ifdef DCT_IFAST_SUPPORTED
      case JDCT_IFAST:
	method_ptr = jpeg_idct_ifast;
	method = JDCT_IFAST;
	break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
      case JDCT_FLOAT:
	method_ptr = jpeg_idct_float;
	method = JDCT_FLOAT;
	break;
#endif
      default:
	ERREXIT(cinfo, JERR_NOT_COMPILED);
	break;
      }
      break;
    default:
      ERREXIT2(cinfo, JERR_BAD_DCTSIZE,
	       compptr->DCT_h_scaled_size, compptr->DCT_v_scaled_size);
      break;
    }
    idct->pub.inverse_DCT[ci] = method_ptr;
    /* Create multiplier table from quant table.
     * However, we can skip this if the component is uninteresting
     * or if we already built the table.  Also, if no quant table
     * has yet been saved for the component, we leave the
     * multiplier table all-zero; we'll be reading zeroes from the
     * coefficient controller's buffer anyway.
     */
    if (! compptr->component_needed || idct->cur_method[ci] == method)
      continue;
    qtbl = compptr->quant_table;
    if (qtbl == NULL)		/* happens if no data yet for component */
      continue;
    idct->cur_method[ci] = method;
    switch (method) {
#ifdef PROVIDE_ISLOW_TABLES
    case JDCT_ISLOW:
      {
	/* For LL&M IDCT method, multipliers are equal to raw quantization
	 * coefficients, but are stored as ints to ensure access efficiency.
	 */
	ISLOW_MULT_TYPE * ismtbl = (ISLOW_MULT_TYPE *) compptr->dct_table;
	for (i = 0; i < DCTSIZE2; i++) {
	  ismtbl[i] = (ISLOW_MULT_TYPE) qtbl->quantval[i];
	}
      }
      break;
#endif
#ifdef DCT_IFAST_SUPPORTED
    case JDCT_IFAST:
      {
	/* For AA&N IDCT method, multipliers are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * For integer operation, the multiplier table is to be scaled by
	 * IFAST_SCALE_BITS.
	 */
	IFAST_MULT_TYPE * ifmtbl = (IFAST_MULT_TYPE *) compptr->dct_table;
#define CONST_BITS 14
	static const INT16 aanscales[DCTSIZE2] = {
	  /* precomputed values scaled up by 14 bits */
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  22725, 31521, 29692, 26722, 22725, 17855, 12299,  6270,
	  21407, 29692, 27969, 25172, 21407, 16819, 11585,  5906,
	  19266, 26722, 25172, 22654, 19266, 15137, 10426,  5315,
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  12873, 17855, 16819, 15137, 12873, 10114,  6967,  3552,
	   8867, 12299, 11585, 10426,  8867,  6967,  4799,  2446,
	   4520,  6270,  5906,  5315,  4520,  3552,  2446,  1247
	};
	SHIFT_TEMPS

	for (i = 0; i < DCTSIZE2; i++) {
	  ifmtbl[i] = (IFAST_MULT_TYPE)
	    DESCALE(MULTIPLY16V16((INT32) qtbl->quantval[i],
				  (INT32) aanscales[i]),
		    CONST_BITS-IFAST_SCALE_BITS);
	}
      }
      break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
    case JDCT_FLOAT:
      {
	/* For float AA&N IDCT method, multipliers are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * We apply a further scale factor of 1/8.
	 */
	FLOAT_MULT_TYPE * fmtbl = (FLOAT_MULT_TYPE *) compptr->dct_table;
	int row, col;
	static const double aanscalefactor[DCTSIZE] = {
	  1.0, 1.387039845, 1.306562965, 1.175875602,
	  1.0, 0.785694958, 0.541196100, 0.275899379
	};

	i = 0;
	for (row = 0; row < DCTSIZE; row++) {
	  for (col = 0; col < DCTSIZE; col++) {
	    fmtbl[i] = (FLOAT_MULT_TYPE)
	      ((double) qtbl->quantval[i] *
	       aanscalefactor[row] * aanscalefactor[col] * 0.125);
	    i++;
	  }
	}
      }
      break;
#endif
    default:
      ERREXIT(cinfo, JERR_NOT_COMPILED);
      break;
    }
  }
}